

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

string * __thiscall
dynamicgraph::command::Value::stringValue_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  long *plVar1;
  long lVar2;
  ExceptionAbstract *this_00;
  int local_44;
  string local_40;
  
  if (this->type_ == STRING) {
    plVar1 = (long *)this->value_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
    return __return_storage_ptr__;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_44 = 700;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"value is not an string","");
  ExceptionAbstract::ExceptionAbstract(this_00,&local_44,&local_40);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

std::string Value::stringValue() const {
  if (type_ == STRING) return *((const std::string *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS, "value is not an string");
}